

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

size_t __thiscall
OpenMesh::PropertyT<OpenMesh::VectorT<unsigned_char,_3>_>::size_of
          (PropertyT<OpenMesh::VectorT<unsigned_char,_3>_> *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  const_iterator cVar2;
  const_iterator cVar3;
  PropertyT<OpenMesh::VectorT<unsigned_char,_3>_> *this_local;
  
  iVar1 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xc])();
  if (CONCAT44(extraout_var,iVar1) == -1) {
    cVar2 = std::
            vector<OpenMesh::VectorT<unsigned_char,_3>,_std::allocator<OpenMesh::VectorT<unsigned_char,_3>_>_>
            ::begin(&this->data_);
    cVar3 = std::
            vector<OpenMesh::VectorT<unsigned_char,_3>,_std::allocator<OpenMesh::VectorT<unsigned_char,_3>_>_>
            ::end(&this->data_);
    this_local = (PropertyT<OpenMesh::VectorT<unsigned_char,_3>_> *)
                 std::
                 accumulate<__gnu_cxx::__normal_iterator<OpenMesh::VectorT<unsigned_char,3>const*,std::vector<OpenMesh::VectorT<unsigned_char,3>,std::allocator<OpenMesh::VectorT<unsigned_char,3>>>>,unsigned_long,OpenMesh::PropertyT<OpenMesh::VectorT<unsigned_char,3>>::plus>
                           (cVar2._M_current,cVar3._M_current,0);
  }
  else {
    iVar1 = (*(this->super_BaseProperty)._vptr_BaseProperty[0xb])();
    this_local = (PropertyT<OpenMesh::VectorT<unsigned_char,_3>_> *)
                 BaseProperty::size_of(&this->super_BaseProperty,CONCAT44(extraout_var_00,iVar1));
  }
  return (size_t)this_local;
}

Assistant:

virtual size_t size_of(void) const
  {
    if (element_size() != IO::UnknownSize)
      return this->BaseProperty::size_of(n_elements());
    return std::accumulate(data_.begin(), data_.end(), size_t(0), plus());
  }